

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

void render_open_li_block(MD_HTML *r,MD_BLOCK_LI_DETAIL *det)

{
  MD_HTML *in_RSI;
  MD_CHAR *in_stack_ffffffffffffffe8;
  
  if (*(int *)&in_RSI->process_output == 0) {
    render_verbatim(in_RSI,in_stack_ffffffffffffffe8,0);
  }
  else {
    render_verbatim(in_RSI,in_stack_ffffffffffffffe8,0);
    if ((*(char *)((long)&in_RSI->process_output + 4) == 'x') ||
       (*(char *)((long)&in_RSI->process_output + 4) == 'X')) {
      render_verbatim(in_RSI,in_stack_ffffffffffffffe8,0);
    }
    render_verbatim(in_RSI,in_stack_ffffffffffffffe8,0);
  }
  return;
}

Assistant:

static void
render_open_li_block(MD_HTML* r, const MD_BLOCK_LI_DETAIL* det)
{
    if(det->is_task) {
        RENDER_VERBATIM(r, "<li class=\"task-list-item\">"
                          "<input type=\"checkbox\" class=\"task-list-item-checkbox\" disabled");
        if(det->task_mark == 'x' || det->task_mark == 'X')
            RENDER_VERBATIM(r, " checked");
        RENDER_VERBATIM(r, ">");
    } else {
        RENDER_VERBATIM(r, "<li>");
    }
}